

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

void __thiscall
google::protobuf::io::CodedOutputStream::WriteLittleEndian32(CodedOutputStream *this,uint32 value)

{
  uint32 *puVar1;
  bool bVar2;
  uint8 bytes [4];
  uint32 local_4;
  
  bVar2 = (uint)this->buffer_size_ < 4;
  if (bVar2) {
    puVar1 = &local_4;
  }
  else {
    puVar1 = (uint32 *)this->buffer_;
  }
  *puVar1 = value;
  if (bVar2) {
    WriteRaw(this,&local_4,4);
  }
  else {
    this->buffer_ = this->buffer_ + 4;
    this->buffer_size_ = this->buffer_size_ + -4;
  }
  return;
}

Assistant:

void CodedOutputStream::WriteLittleEndian32(uint32 value) {
  uint8 bytes[sizeof(value)];

  bool use_fast = buffer_size_ >= sizeof(value);
  uint8* ptr = use_fast ? buffer_ : bytes;

  WriteLittleEndian32ToArray(value, ptr);

  if (use_fast) {
    Advance(sizeof(value));
  } else {
    WriteRaw(bytes, sizeof(value));
  }
}